

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynhds.c
# Opt level: O2

nghttp2_nv * Curl_dynhds_to_nva(dynhds *dynhds,size_t *pcount)

{
  size_t sVar1;
  dynhds_entry *pdVar2;
  uint8_t *puVar3;
  size_t sVar4;
  nghttp2_nv *pnVar5;
  uint8_t *puVar6;
  size_t sVar7;
  
  pnVar5 = (nghttp2_nv *)(*Curl_ccalloc)(1,dynhds->hds_len * 0x28);
  *pcount = 0;
  if (pnVar5 != (nghttp2_nv *)0x0) {
    sVar1 = dynhds->hds_len;
    puVar6 = &pnVar5->flags;
    for (sVar7 = 0; sVar1 != sVar7; sVar7 = sVar7 + 1) {
      pdVar2 = dynhds->hds[sVar7];
      puVar3 = (uint8_t *)pdVar2->value;
      ((nghttp2_nv *)(puVar6 + -0x20))->name = (uint8_t *)pdVar2->name;
      *(uint8_t **)(puVar6 + -0x18) = puVar3;
      sVar4 = pdVar2->valuelen;
      *(size_t *)(puVar6 + -0x10) = pdVar2->namelen;
      *(size_t *)(puVar6 + -8) = sVar4;
      *puVar6 = '\0';
      puVar6 = puVar6 + 0x28;
    }
    *pcount = sVar1;
  }
  return pnVar5;
}

Assistant:

nghttp2_nv *Curl_dynhds_to_nva(struct dynhds *dynhds, size_t *pcount)
{
  nghttp2_nv *nva = calloc(1, sizeof(nghttp2_nv) * dynhds->hds_len);
  size_t i;

  *pcount = 0;
  if(!nva)
    return NULL;

  for(i = 0; i < dynhds->hds_len; ++i) {
    struct dynhds_entry *e = dynhds->hds[i];
    DEBUGASSERT(e);
    nva[i].name = (unsigned char *)e->name;
    nva[i].namelen = e->namelen;
    nva[i].value = (unsigned char *)e->value;
    nva[i].valuelen = e->valuelen;
    nva[i].flags = NGHTTP2_NV_FLAG_NONE;
  }
  *pcount = dynhds->hds_len;
  return nva;
}